

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O3

void UnityAssertEqualMemory
               (void *expected,void *actual,UNITY_UINT32 length,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  UNITY_UINT32 UVar4;
  UNITY_UINT32 UVar5;
  UNITY_UINT number;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if ((length == 0) || (num_elements == 0)) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00102940:
      UnityAddMsgIfSpecified(msg);
LAB_00102945:
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if (expected != actual) {
      iVar1 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      if (iVar1 != 0) goto LAB_00102945;
      lVar2 = (ulong)(length - 1) + 1;
      pvVar3 = expected;
      UVar5 = num_elements;
      do {
        UVar4 = UVar5 - 1;
        number = 0;
        do {
          if (*(char *)((long)pvVar3 + number) != *(char *)((long)actual + number)) {
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(" Memory Mismatch.");
            if (num_elements != 1) {
              UnityPrint(" Element ");
              UnityPrintNumberUnsigned((ulong)(num_elements - UVar5));
            }
            UnityPrint(" Byte ");
            UnityPrintNumberUnsigned(number);
            UnityPrint(" Expected ");
            UnityPrintNumberByStyle
                      ((ulong)*(byte *)((long)pvVar3 + number),UNITY_DISPLAY_STYLE_HEX8);
            UnityPrint(" Was ");
            UnityPrintNumberByStyle
                      ((ulong)*(byte *)((long)actual + number),UNITY_DISPLAY_STYLE_HEX8);
            goto LAB_00102940;
          }
          number = number + 1;
        } while (length != (UNITY_UINT32)number);
        pvVar3 = (void *)(lVar2 + (long)pvVar3);
        if (flags == UNITY_ARRAY_TO_VAL) {
          pvVar3 = expected;
        }
        actual = (void *)((long)actual + lVar2);
        UVar5 = UVar4;
      } while (UVar4 != 0);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualMemory(UNITY_INTERNAL_PTR expected,
                            UNITY_INTERNAL_PTR actual,
                            const UNITY_UINT32 length,
                            const UNITY_UINT32 num_elements,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber,
                            const UNITY_FLAGS_T flags)
{
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_act = (UNITY_PTR_ATTRIBUTE const unsigned char*)actual;
    UNITY_UINT32 elements = num_elements;
    UNITY_UINT32 bytes;

    RETURN_IF_FAIL_OR_IGNORE;

    if ((elements == 0) || (length == 0))
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual) return; /* Both are NULL or same pointer */
    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
        UNITY_FAIL_AND_BAIL;

    while (elements--)
    {
        bytes = length;
        while (bytes--)
        {
            if (*ptr_exp != *ptr_act)
            {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(UnityStrMemory);
                if (num_elements > 1)
                {
                    UnityPrint(UnityStrElement);
                    UnityPrintNumberUnsigned(num_elements - elements - 1);
                }
                UnityPrint(UnityStrByte);
                UnityPrintNumberUnsigned(length - bytes - 1);
                UnityPrint(UnityStrExpected);
                UnityPrintNumberByStyle(*ptr_exp, UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(UnityStrWas);
                UnityPrintNumberByStyle(*ptr_act, UNITY_DISPLAY_STYLE_HEX8);
                UnityAddMsgIfSpecified(msg);
                UNITY_FAIL_AND_BAIL;
            }
            ptr_exp++;
            ptr_act++;
        }
        if (flags == UNITY_ARRAY_TO_VAL)
        {
            ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
        }
    }
}